

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compiler.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pbVar1;
  pointer pcVar2;
  char *pcVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar5;
  const_iterator cVar6;
  any *paVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  char **ppcVar10;
  int iVar11;
  bool bVar12;
  string mode;
  string filepath;
  positional_options_description p;
  variables_map vm;
  options_description desc;
  long *local_288 [2];
  long local_278 [2];
  undefined1 local_268 [16];
  undefined1 local_258 [24];
  undefined1 local_240 [32];
  pointer local_220 [2];
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0 [2];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1d0 [32];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_1b0 [32];
  long **local_190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  long *local_170;
  long local_160 [2];
  code *local_150 [2];
  long local_140;
  _Rb_tree_node_base local_138;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  long *local_b0 [2];
  long local_a0 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_88 [24];
  void *local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  long local_50;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_48 [24];
  
  local_150[0] = (code *)&local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Allowed options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_b0,(string *)local_150,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if (local_150[0] != (code *)&local_140) {
    operator_delete(local_150[0],local_140 + 1);
  }
  local_150[0] = (code *)boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_150,"help,h");
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"mode,m",(char *)ptVar4);
  ptVar5 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x0);
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"input-file",(char *)ptVar5);
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_188);
  boost::program_options::positional_options_description::add((char *)&local_188,0x10f084);
  boost::program_options::variables_map::variables_map((variables_map *)local_150);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)(local_210 + 0x10),argc,argv);
  boost::program_options::detail::cmdline::set_options_description
            ((options_description *)(local_210 + 0x10));
  local_190 = local_b0;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)(local_210 + 0x10));
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)local_268,
             (basic_command_line_parser<char> *)(local_210 + 0x10));
  boost::program_options::store((basic_parsed_options *)local_268,(variables_map *)local_150,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_268);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_1b0);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_210 + 0x10));
  boost::program_options::notify((variables_map *)local_150);
  local_200._M_allocated_capacity = (size_type)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_210 + 0x10),"input-file","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)&local_140,(key_type *)(local_210 + 0x10));
  if (cVar6._M_node == &local_138) {
    bVar12 = false;
  }
  else {
    local_268._0_8_ = local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"mode","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)&local_140,(key_type *)local_268);
    bVar12 = cVar6._M_node != &local_138;
    if ((pointer)local_268._0_8_ != (pointer)local_258) {
      operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_allocated_capacity != local_1f0) {
    operator_delete((void *)local_200._M_allocated_capacity,local_1f0[0]._M_allocated_capacity + 1);
  }
  if (bVar12) {
    local_288[0] = local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"input-file","");
    paVar7 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_150);
    pvVar8 = boost::
             any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                       (paVar7);
    pbVar1 = (pvVar8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    local_200._M_allocated_capacity = (size_type)local_1f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_210 + 0x10),pcVar2,pcVar2 + pbVar1->_M_string_length);
    if (local_288[0] != local_278) {
      operator_delete(local_288[0],local_278[0] + 1);
    }
    local_220[0] = (pointer)local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"mode","");
    paVar7 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_150);
    pbVar9 = boost::any_cast<std::__cxx11::string_const&>(paVar7);
    pcVar2 = (pbVar9->_M_dataplus)._M_p;
    local_288[0] = local_278;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_288,pcVar2,pcVar2 + pbVar9->_M_string_length);
    if (local_220[0] != (pointer)local_210) {
      operator_delete(local_220[0],(ulong)(local_210._0_8_ + 1));
    }
    ppcVar10 = std::
               __find_if<char_const**,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (tester::test_mode,&PTR_typeinfo_00115278,local_288);
    iVar11 = 1;
    if (ppcVar10 == &PTR_typeinfo_00115278) {
LAB_00105d10:
      bVar12 = false;
    }
    else {
      local_240._0_8_ = local_258 + 0x28;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_258 + 0x18),local_200._M_allocated_capacity,
                 local_200._8_8_ + local_200._M_allocated_capacity);
      bVar12 = lexer_tester::test_file((string *)(local_258 + 0x18));
      if ((undefined1 *)local_240._0_8_ != local_258 + 0x28) {
        operator_delete((void *)local_240._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_240._16_8_)->_M_p + 1));
      }
      if (!bVar12) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAIL",4);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
        std::ostream::put(-0x60);
        std::ostream::flush();
        goto LAB_00105d10;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PASS",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      iVar11 = 0;
      bVar12 = true;
    }
    if (local_288[0] != local_278) {
      operator_delete(local_288[0],local_278[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_allocated_capacity != local_1f0) {
      operator_delete((void *)local_200._M_allocated_capacity,local_1f0[0]._M_allocated_capacity + 1
                     );
    }
    if (!bVar12) goto LAB_00105d4d;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"USAGE: ./tester <flags> <test file>",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FLAGS:",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\t-help/-h : display this message",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\t-mode/-m : [lexer/parser/semantics/codegen/optimizer]",0x36)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  iVar11 = 0;
LAB_00105d4d:
  local_150[0] = __cxa_throw;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_110);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)&local_140);
  if (local_170 != local_160) {
    operator_delete(local_170,local_160[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_48);
  if (local_70 != (void *)0x0) {
    operator_delete(local_70,local_50 - (long)local_70);
    local_70 = (void *)0x0;
    local_68 = 0;
    local_60 = 0;
    local_58 = 0;
    local_50 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_88);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  return iVar11;
}

Assistant:

int main(int argc, char *argv[]) {

    po::options_description desc("Allowed options");
    desc.add_options()
            ("help,h", "produce help message")
            ("mode,m", po::value<string>(), "mode")
            ("input-file", po::value< vector<string> >(), "input file")
            ;

    po::positional_options_description p;
    p.add("input-file", -1);

    po::variables_map vm;
    po::store(po::command_line_parser(argc, argv).
            options(desc).positional(p).run(), vm);
    po::notify(vm);

    if (vm.count("input-file") && vm.count("mode")) {
        string filepath = vm["input-file"].as< vector<string> >().front();
        string mode = vm["mode"].as<string>();

        if(!(exists_in_set(mode, test_mode))) {
            return 1;
        }

        // Handle file
        bool result = lexer_tester::test_file(filepath);

        if(result) {
            print("PASS");
        }
        else {
            print("FAIL");
            return 1;
        }
    }
    else {
        print("USAGE: ./tester <flags> <test file>");
        print("FLAGS:");
        print("\t-help/-h : display this message");
        print("\t-mode/-m : [lexer/parser/semantics/codegen/optimizer]");
    }

    return 0;

}